

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::ChildrenAnswers::PushBack(ChildrenAnswers *this,string *description,int id)

{
  value_type_conflict1 local_14;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->descriptions,description);
  std::vector<int,_std::allocator<int>_>::push_back(&this->ids,&local_14);
  return;
}

Assistant:

void IRT::ChildrenAnswers::PushBack( std::string description, int id ) {
    this->descriptions.push_back( description );
    this->ids.push_back( id );
}